

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

bool accelerator_start_where_proc(Am_Object *inter,Am_Object *event_window,Am_Input_Char ic)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value_00;
  Am_Object cmd;
  Am_Value value;
  Am_Value_List accel_list;
  Am_Value_List AStack_58;
  Am_Value local_48;
  Am_Value_List local_38;
  Am_Value_List local_28;
  
  Am_Value_List::Am_Value_List(&local_38);
  local_48.type = 0;
  local_48.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(event_window,0x1e3,1);
  Am_Value::operator=(&local_48,pAVar2);
  bVar1 = Am_Value::Valid(&local_48);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(&local_48);
    if (bVar1) {
      Am_Value_List::operator=(&local_38,&local_48);
      Am_Value_List::Am_Value_List(&local_28,&local_38);
      Am_Object::Am_Object((Am_Object *)&AStack_58.item,event_window);
      accel_match(&AStack_58,SUB84(&local_28,0),(Am_Object *)(ulong)(uint)ic);
      Am_Object::~Am_Object((Am_Object *)&AStack_58.item);
      Am_Value_List::~Am_Value_List(&local_28);
      bVar1 = Am_Object::Valid((Am_Object *)&AStack_58);
      if (bVar1) {
        pAVar2 = Am_Object::Get((Am_Object *)&AStack_58,0xcc,0);
        bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
        if (bVar1) {
          value_00 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&AStack_58);
          Am_Object::Set(inter,0x152,value_00,1);
          Am_Object::~Am_Object((Am_Object *)&AStack_58);
          bVar1 = true;
          goto LAB_0025f3ed;
        }
      }
      Am_Object::~Am_Object((Am_Object *)&AStack_58);
    }
  }
  bVar1 = false;
LAB_0025f3ed:
  Am_Value::~Am_Value(&local_48);
  Am_Value_List::~Am_Value_List(&local_38);
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Event_Method, bool, accelerator_start_where,
                 (Am_Object inter, Am_Object event_window, Am_Input_Char ic))
{
  Am_INTER_TRACE_PRINT(inter, "testing " << ic << " as accelerator for "
                                         << event_window);
  Am_Value_List accel_list;
  Am_Value value;
  value = event_window.Peek(Am_ACCELERATOR_LIST);
  if (value.Valid() && Am_Value_List::Test(value)) {
    accel_list = value;
    Am_Object cmd = accel_match(accel_list, ic, event_window);
    if (cmd.Valid()) {
      Am_INTER_TRACE_PRINT(inter, "Found accelerator " << cmd);
      if ((bool)cmd.Get(Am_ACTIVE)) {
        inter.Set(Am_ACCELERATOR, cmd, Am_OK_IF_NOT_THERE);
        return true;
      } else {
        Am_INTER_TRACE_PRINT(inter, "-> but not active");
      }
    }
  }
  //if get here, then fail
  return false;
}